

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.cc
# Opt level: O3

void __thiscall Graph::update_edge(Graph *this,string *begin,string *end,double weight)

{
  pointer pGVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  GNode *pGVar4;
  GNode *pGVar5;
  ostream *poVar6;
  GEdge *edge;
  pointer pGVar7;
  
  bVar2 = search(this,begin);
  if (bVar2) {
    pGVar4 = get_node(this,begin);
    bVar2 = search(this,end);
    begin = end;
    if (bVar2) {
      pGVar5 = get_node(this,end);
      pGVar7 = (pGVar4->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pGVar1 = (pGVar4->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pGVar7 != pGVar1) {
        __n = (pGVar5->name)._M_string_length;
        do {
          if (((pGVar7->node->name)._M_string_length == __n) &&
             ((__n == 0 ||
              (iVar3 = bcmp((pGVar7->node->name)._M_dataplus._M_p,(pGVar5->name)._M_dataplus._M_p,
                            __n), iVar3 == 0)))) {
            pGVar7->weight = weight;
          }
          pGVar7 = pGVar7 + 1;
        } while (pGVar7 != pGVar1);
      }
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: no node \"",0x10)
  ;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(begin->_M_dataplus)._M_p,begin->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" exists \n",10);
  return;
}

Assistant:

void Graph::update_edge(const std::string &begin, const std::string &end, double weight) {
    if (search(begin)) {
        GNode *origin = get_node(begin);
        GNode *dest;

        if (search(end)) {
            dest = get_node(end);
            for (auto & edge : origin->edges) {
                if (edge.node->name == dest->name) {
                    edge.weight = weight;
                }
            }
        } else {
            cout << "Error: no node \"" << end << "\" exists \n";
        }
    } else {
        cout << "Error: no node \"" << begin << "\" exists \n";
    }
}